

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdefaultrt.hpp
# Opt level: O3

int __thiscall
soplex::SPxDefaultRT<double>::selectLeave
          (SPxDefaultRT<double> *this,double *val,double param_2,bool param_3)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  long lVar8;
  undefined7 in_register_00000011;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long in_FS_OFFSET;
  Real RVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  uint local_a4;
  
  iVar7 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])
                    (this,val,CONCAT71(in_register_00000011,param_3));
  SSVectorBase<double>::setup
            ((SSVectorBase<double> *)(*(long *)(CONCAT44(extraout_var,iVar7) + 0x6a8) + 0x20));
  iVar7 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  lVar2 = **(long **)(CONCAT44(extraout_var_00,iVar7) + 0x6a8);
  iVar7 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  lVar3 = *(long *)(*(long *)(CONCAT44(extraout_var_01,iVar7) + 0x6a8) + 0x40);
  iVar7 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  lVar4 = *(long *)(CONCAT44(extraout_var_02,iVar7) + 0x6a8);
  iVar7 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  lVar5 = *(long *)(CONCAT44(extraout_var_03,iVar7) + 0x670);
  iVar7 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  lVar8 = *(long *)(CONCAT44(extraout_var_04,iVar7) + 0x688);
  iVar7 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  RVar12 = Tolerances::epsilon(*(Tolerances **)(CONCAT44(extraout_var_05,iVar7) + 0x1b8));
  if (*val <= 0.0) {
    if (*(int *)(lVar4 + 0x28) < 1) {
      return -1;
    }
    dVar14 = *(double *)(in_FS_OFFSET + -8);
    local_a4 = 0xffffffff;
    lVar11 = 0;
    do {
      uVar1 = *(uint *)(*(long *)(lVar4 + 0x30) + lVar11 * 4);
      lVar10 = (long)(int)uVar1;
      dVar15 = *(double *)(lVar3 + lVar10 * 8);
      if (-RVar12 <= dVar15) {
        if ((RVar12 < dVar15) &&
           (dVar13 = *(double *)(lVar8 + lVar10 * 8), ::soplex::infinity::__tls_init(),
           -dVar14 < dVar13)) {
          dVar13 = (*(double *)(lVar8 + lVar10 * 8) - *(double *)(lVar2 + lVar10 * 8)) -
                   (this->super_SPxRatioTester<double>).delta;
          goto LAB_002109ba;
        }
      }
      else {
        dVar13 = *(double *)(lVar5 + lVar10 * 8);
        ::soplex::infinity::__tls_init();
        if (dVar13 < dVar14) {
          dVar13 = (*(double *)(lVar5 + lVar10 * 8) - *(double *)(lVar2 + lVar10 * 8)) +
                   (this->super_SPxRatioTester<double>).delta;
LAB_002109ba:
          dVar13 = dVar13 / dVar15;
          if (*val <= dVar13 && dVar13 != *val) {
            *val = dVar13;
            local_a4 = uVar1;
          }
        }
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < *(int *)(lVar4 + 0x28));
    if ((int)local_a4 < 0) {
      return local_a4;
    }
    uVar9 = (ulong)local_a4;
    dVar14 = *(double *)(lVar3 + uVar9 * 8);
    if ((-RVar12 <= dVar14) || (*(double *)(lVar2 + uVar9 * 8) < *(double *)(lVar5 + uVar9 * 8))) {
      if ((RVar12 < dVar14) &&
         (dVar15 = 0.0, *(double *)(lVar2 + uVar9 * 8) <= *(double *)(lVar8 + uVar9 * 8)))
      goto LAB_00210a8e;
      bVar6 = dVar14 < RVar12;
      goto LAB_00210a5c;
    }
  }
  else {
    if (*(int *)(lVar4 + 0x28) < 1) {
      return -1;
    }
    dVar14 = *(double *)(in_FS_OFFSET + -8);
    local_a4 = 0xffffffff;
    lVar11 = 0;
    do {
      uVar1 = *(uint *)(*(long *)(lVar4 + 0x30) + lVar11 * 4);
      lVar10 = (long)(int)uVar1;
      dVar15 = *(double *)(lVar3 + lVar10 * 8);
      if (dVar15 <= RVar12) {
        if ((dVar15 < -RVar12) &&
           (dVar13 = *(double *)(lVar8 + lVar10 * 8), ::soplex::infinity::__tls_init(),
           -dVar14 < dVar13)) {
          dVar13 = (*(double *)(lVar8 + lVar10 * 8) - *(double *)(lVar2 + lVar10 * 8)) -
                   (this->super_SPxRatioTester<double>).delta;
          goto LAB_002107df;
        }
      }
      else {
        dVar13 = *(double *)(lVar5 + lVar10 * 8);
        ::soplex::infinity::__tls_init();
        if (dVar13 < dVar14) {
          dVar13 = (*(double *)(lVar5 + lVar10 * 8) - *(double *)(lVar2 + lVar10 * 8)) +
                   (this->super_SPxRatioTester<double>).delta;
LAB_002107df:
          if (dVar13 / dVar15 < *val) {
            *val = dVar13 / dVar15;
            local_a4 = uVar1;
          }
        }
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < *(int *)(lVar4 + 0x28));
    if ((int)local_a4 < 0) {
      return local_a4;
    }
    uVar9 = (ulong)local_a4;
    dVar14 = *(double *)(lVar3 + uVar9 * 8);
    bVar6 = RVar12 < dVar14;
    if ((dVar14 <= RVar12) || (*(double *)(lVar2 + uVar9 * 8) < *(double *)(lVar5 + uVar9 * 8))) {
      if ((dVar14 < -RVar12) &&
         (dVar15 = 0.0, *(double *)(lVar2 + uVar9 * 8) <= *(double *)(lVar8 + uVar9 * 8)))
      goto LAB_00210a8e;
LAB_00210a5c:
      if (bVar6) {
        lVar8 = lVar5;
      }
      dVar15 = *(double *)(lVar8 + uVar9 * 8);
      *val = dVar15;
      dVar15 = (dVar15 - *(double *)(lVar2 + uVar9 * 8)) / dVar14;
      goto LAB_00210a8e;
    }
  }
  dVar15 = 0.0;
LAB_00210a8e:
  *val = dVar15;
  return local_a4;
}

Assistant:

int SPxDefaultRT<R>::selectLeave(R& val, R, bool)
{
   this->solver()->fVec().delta().setup();

   const R*   vec = this->solver()->fVec().get_const_ptr();
   const R*   upd = this->solver()->fVec().delta().values();
   const IdxSet& idx = this->solver()->fVec().idx();
   const R*   ub  = this->solver()->ubBound().get_const_ptr();
   const R*   lb  = this->solver()->lbBound().get_const_ptr();

   R epsilon = this->solver()->epsilon();
   int  leave   = -1;

   R x;
   int  i;
   int  j;

   // PARALLEL the j loop could be parallelized
   if(val > 0)
   {
      // Loop over NZEs of delta vector.
      for(j = 0; j < idx.size(); ++j)
      {
         i = idx.index(j);
         x = upd[i];

         if(x > epsilon)
         {
            if(ub[i] < R(infinity))
            {
               R y = (ub[i] - vec[i] + this->delta) / x;

               if(y < val)
               {
                  leave = i;
                  val   = y;
               }
            }
         }
         else if(x < -epsilon)
         {
            if(lb[i] > R(-infinity))
            {
               R y = (lb[i] - vec[i] - this->delta) / x;

               if(y < val)
               {
                  leave = i;
                  val   = y;
               }
            }
         }
      }

      if(leave >= 0)
      {
         x   = upd[leave];

         // BH 2005-11-30: It may well happen that the basis is degenerate and the
         // selected leaving variable is (at most this->delta) beyond its bound. (This
         // happens for instance on LP/netlib/adlittle.mps with setting -r -t0.)
         // In that case we do a pivot step with length zero to avoid difficulties.
         if((x > epsilon  && vec[leave] >= ub[leave]) ||
               (x < -epsilon && vec[leave] <= lb[leave]))
         {
            val = 0.0;
         }
         else
         {
            val = (x > epsilon) ? ub[leave] : lb[leave];
            val = (val - vec[leave]) / x;
         }
      }

      SOPLEX_ASSERT_WARN("WDEFRT01", val > -epsilon);
   }
   else
   {
      for(j = 0; j < idx.size(); ++j)
      {
         i = idx.index(j);
         x = upd[i];

         if(x < -epsilon)
         {
            if(ub[i] < R(infinity))
            {
               R y = (ub[i] - vec[i] + this->delta) / x;

               if(y > val)
               {
                  leave = i;
                  val   = y;
               }
            }
         }
         else if(x > epsilon)
         {
            if(lb[i] > R(-infinity))
            {
               R y = (lb[i] - vec[i] - this->delta) / x;

               if(y > val)
               {
                  leave = i;
                  val   = y;
               }
            }
         }
      }

      if(leave >= 0)
      {
         x   = upd[leave];

         // See comment above.
         if((x < -epsilon && vec[leave] >= ub[leave]) ||
               (x > epsilon  && vec[leave] <= lb[leave]))
         {
            val = 0.0;
         }
         else
         {
            val = (x < epsilon) ? ub[leave] : lb[leave];
            val = (val - vec[leave]) / x;
         }
      }

      SOPLEX_ASSERT_WARN("WDEFRT02", val < epsilon);
   }

   return leave;
}